

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlDocPtr xmlCtxtReadFd(xmlParserCtxtPtr ctxt,int fd,char *URL,char *encoding,int options)

{
  xmlParserInputPtr input;
  xmlDocPtr pxVar1;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    xmlCtxtReset(ctxt);
    xmlCtxtUseOptions(ctxt,options);
    input = xmlCtxtNewInputFromFd(ctxt,URL,fd,encoding,0);
    if (input != (xmlParserInputPtr)0x0) {
      pxVar1 = xmlCtxtParseDocument(ctxt,input);
      return pxVar1;
    }
  }
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlCtxtReadFd(xmlParserCtxtPtr ctxt, int fd,
              const char *URL, const char *encoding, int options)
{
    xmlParserInputPtr input;

    if (ctxt == NULL)
        return(NULL);

    xmlCtxtReset(ctxt);
    xmlCtxtUseOptions(ctxt, options);

    input = xmlCtxtNewInputFromFd(ctxt, URL, fd, encoding, 0);
    if (input == NULL)
        return(NULL);

    return(xmlCtxtParseDocument(ctxt, input));
}